

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn2.hpp
# Opt level: O1

void __thiscall trng::yarn2::split(yarn2 *this,uint s,uint n)

{
  undefined1 auVar1 [16];
  int32_t iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint i_3;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint i;
  bool bVar16;
  int32_t b [4];
  int32_t a [2];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  
  uVar9 = (ulong)s;
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_48,"invalid argument for trng::yarn2::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_48);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_48);
  }
  if (1 < s) {
    uVar15 = (ulong)n + 1;
    if (n < 0xf) {
      iVar8 = (this->S).r[0];
      iVar3 = (this->S).r[1];
      do {
        iVar10 = iVar8;
        uVar12 = (long)iVar3 * (long)(this->P).a[1] + (long)iVar10 * (long)(this->P).a[0];
        uVar13 = (uVar12 >> 0x1f) + (uVar12 & 0x7fffffff);
        uVar12 = uVar13 - 0xfffffffe;
        if (uVar13 < 0xfffffffe) {
          uVar12 = uVar13;
        }
        iVar8 = (int)uVar12 + -0x7fffffff;
        if (uVar12 < 0x7fffffff) {
          iVar8 = (int)uVar12;
        }
        uVar14 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar14;
        iVar3 = iVar10;
      } while (uVar14 != 0);
      (this->S).r[0] = iVar8;
      (this->S).r[1] = iVar10;
    }
    else {
      uVar14 = 0;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar14);
        }
        uVar14 = uVar14 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar8 = (this->S).r[0];
    if (s < 0x10) {
      iVar5 = s + (s == 0);
      iVar3 = iVar8;
      iVar10 = (this->S).r[1];
      do {
        iVar6 = iVar3;
        uVar15 = (long)iVar10 * (long)(this->P).a[1] + (long)iVar6 * (long)(this->P).a[0];
        uVar12 = (uVar15 >> 0x1f) + (uVar15 & 0x7fffffff);
        uVar15 = uVar12 - 0xfffffffe;
        if (uVar12 < 0xfffffffe) {
          uVar15 = uVar12;
        }
        iVar3 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar3 = (int)uVar15;
        }
        iVar5 = iVar5 + -1;
        iVar10 = iVar6;
      } while (iVar5 != 0);
      (this->S).r[0] = iVar3;
      (this->S).r[1] = iVar6;
    }
    else {
      uVar14 = 0;
      uVar15 = uVar9;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar14);
        }
        uVar14 = uVar14 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar3 = (this->S).r[0];
    if (s < 0x10) {
      iVar6 = s + (s == 0);
      iVar10 = iVar3;
      iVar5 = (this->S).r[1];
      do {
        iVar7 = iVar10;
        uVar15 = (long)iVar5 * (long)(this->P).a[1] + (long)iVar7 * (long)(this->P).a[0];
        uVar12 = (uVar15 >> 0x1f) + (uVar15 & 0x7fffffff);
        uVar15 = uVar12 - 0xfffffffe;
        if (uVar12 < 0xfffffffe) {
          uVar15 = uVar12;
        }
        iVar10 = (int)uVar15 + -0x7fffffff;
        if (uVar15 < 0x7fffffff) {
          iVar10 = (int)uVar15;
        }
        iVar6 = iVar6 + -1;
        iVar5 = iVar7;
      } while (iVar6 != 0);
      (this->S).r[0] = iVar10;
      (this->S).r[1] = iVar7;
    }
    else {
      uVar14 = 0;
      uVar15 = uVar9;
      do {
        if ((uVar15 & 1) != 0) {
          jump2(this,uVar14);
        }
        uVar14 = uVar14 + 1;
        bVar16 = 1 < uVar15;
        uVar15 = uVar15 >> 1;
      } while (bVar16);
    }
    iVar10 = (this->S).r[0];
    if (s < 0x10) {
      iVar7 = s + (s == 0);
      iVar5 = (this->S).r[1];
      iVar6 = iVar10;
      do {
        iVar11 = iVar6;
        uVar9 = (long)iVar5 * (long)(this->P).a[1] + (long)iVar11 * (long)(this->P).a[0];
        uVar15 = (uVar9 >> 0x1f) + (uVar9 & 0x7fffffff);
        uVar9 = uVar15 - 0xfffffffe;
        if (uVar15 < 0xfffffffe) {
          uVar9 = uVar15;
        }
        iVar6 = (int)uVar9 + -0x7fffffff;
        if (uVar9 < 0x7fffffff) {
          iVar6 = (int)uVar9;
        }
        iVar7 = iVar7 + -1;
        iVar5 = iVar11;
      } while (iVar7 != 0);
      (this->S).r[0] = iVar6;
      (this->S).r[1] = iVar11;
    }
    else {
      uVar14 = 0;
      do {
        if ((uVar9 & 1) != 0) {
          jump2(this,uVar14);
        }
        uVar14 = uVar14 + 1;
        bVar16 = 1 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar16);
    }
    iStack_34 = (this->S).r[0];
    local_48 = iVar3;
    local_44 = iVar8;
    local_40 = iVar10;
    local_3c = iVar3;
    local_38 = iVar10;
    int_math::gauss<2>((int32_t (*) [4])&local_48,(int32_t (*) [2])&local_38,0x7fffffff);
    *(ulong *)(this->P).a = CONCAT44(iStack_34,local_38);
    (this->S).r[0] = iVar3;
    (this->S).r[1] = iVar8;
    iVar8 = 1;
    do {
      iVar3 = (this->P).a[1];
      if (iVar3 == 0) {
        iVar3 = (this->P).a[0];
        if (iVar3 != 0) {
          iVar10 = (this->S).r[1];
          goto LAB_00205233;
        }
        iVar3 = 0;
      }
      else {
        iVar10 = (this->S).r[0];
        lVar4 = (long)(this->S).r[1] * (long)(this->P).a[0];
        auVar1 = SEXT816(lVar4) * ZEXT816(0x8000000100000003);
        iVar5 = ((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * 0x7fffffff - (int)lVar4;
        iVar6 = iVar10 + iVar5;
        iVar10 = iVar10 + iVar5 + 0x7fffffff;
        if (-1 < iVar6) {
          iVar10 = iVar6;
        }
LAB_00205233:
        iVar2 = int_math::modulo_inverse(iVar3,0x7fffffff);
        auVar1 = SEXT816((long)iVar2 * (long)iVar10) * ZEXT816(0x8000000100000003);
        iVar3 = (int)((long)iVar2 * (long)iVar10) +
                ((int)(auVar1._8_8_ >> 0x1e) - (auVar1._12_4_ >> 0x1f)) * -0x7fffffff;
      }
      (this->S).r[0] = (this->S).r[1];
      (this->S).r[1] = iVar3;
      iVar8 = iVar8 + -1;
    } while (iVar8 == 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn2::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn2::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      int32_t a[2], b[4];
      a[0] = q2;
      b[0] = q1;
      b[1] = q0;
      a[1] = q3;
      b[2] = q2;
      b[3] = q1;
      int_math::gauss<2>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      S.r[0] = q1;
      S.r[1] = q0;
      for (int i{0}; i < 2; ++i)
        backward();
    }
  }